

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLcode Curl_getformdata(Curl_easy *data,curl_mimepart *finalform,curl_httppost *post,
                         curl_read_callback fread_func)

{
  ulong uVar1;
  CURLcode CVar2;
  int iVar3;
  curl_mime *subparts;
  curl_mimepart *pcVar4;
  curl_mime *subparts_00;
  curl_off_t *pcVar5;
  size_t datasize;
  char *pcVar6;
  curl_httppost *pcVar7;
  bool bVar8;
  
  Curl_mime_cleanpart(finalform);
  if (post == (curl_httppost *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    subparts = curl_mime_init(data);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (subparts != (curl_mime *)0x0) {
      CVar2 = curl_mime_subparts(finalform,subparts);
    }
    bVar8 = CVar2 == CURLE_OK;
    if (bVar8) {
      do {
        subparts_00 = subparts;
        if (post->more != (curl_httppost *)0x0) {
          pcVar4 = curl_mime_addpart(subparts);
          if (pcVar4 == (curl_mimepart *)0x0) {
            CVar2 = CURLE_OUT_OF_MEMORY;
          }
          if (CVar2 == CURLE_OK) {
            CVar2 = setname(pcVar4,post->name,post->namelength);
          }
          if (CVar2 == CURLE_OK) {
            subparts_00 = curl_mime_init(data);
            CVar2 = CURLE_OK;
            if (subparts_00 == (curl_mime *)0x0) {
              CVar2 = CURLE_OUT_OF_MEMORY;
            }
          }
          if (CVar2 == CURLE_OK) {
            CVar2 = curl_mime_subparts(pcVar4,subparts_00);
          }
        }
        if (CVar2 == CURLE_OK) {
          pcVar7 = post;
          do {
            pcVar4 = curl_mime_addpart(subparts_00);
            if (pcVar4 == (curl_mimepart *)0x0) {
              CVar2 = CURLE_OUT_OF_MEMORY;
            }
            if (CVar2 == CURLE_OK) {
              CVar2 = curl_mime_headers(pcVar4,pcVar7->contentheader,0);
            }
            if (CVar2 == CURLE_OK) {
              if (pcVar7->contenttype == (char *)0x0) {
                CVar2 = CURLE_OK;
              }
              else {
                CVar2 = curl_mime_type(pcVar4,pcVar7->contenttype);
              }
            }
            if ((CVar2 == CURLE_OK) && (CVar2 = CURLE_OK, post->more == (curl_httppost *)0x0)) {
              CVar2 = setname(pcVar4,post->name,post->namelength);
            }
            if (CVar2 == CURLE_OK) {
              uVar1 = post->flags;
              pcVar5 = &post->contentlen;
              if (-1 < (char)uVar1) {
                pcVar5 = &post->contentslength;
              }
              if ((uVar1 & 3) == 0) {
                if ((uVar1 & 0x10) == 0) {
                  datasize = -(ulong)(*pcVar5 == 0) | *pcVar5;
                  if ((uVar1 & 0x40) != 0) {
                    CVar2 = curl_mime_data_cb(pcVar4,datasize,fread_func,(curl_seek_callback)0x0,
                                              (curl_free_callback)0x0,post->userp);
                    goto LAB_0010db0e;
                  }
                  pcVar6 = post->contents;
                }
                else {
                  pcVar6 = post->buffer;
                  datasize = -(ulong)(post->bufferlength == 0) | post->bufferlength;
                }
                CVar2 = curl_mime_data(pcVar4,pcVar6,datasize);
              }
              else {
                pcVar6 = pcVar7->contents;
                iVar3 = strcmp(pcVar6,"-");
                if (iVar3 == 0) {
                  CVar2 = curl_mime_data_cb(pcVar4,-1,fread,fseek,(curl_free_callback)0x0,_stdin);
                }
                else {
                  CVar2 = curl_mime_filedata(pcVar4,pcVar6);
                }
                if ((CVar2 == CURLE_OK) && (CVar2 = CURLE_OK, (post->flags & 2) != 0)) {
                  CVar2 = curl_mime_filename(pcVar4,(char *)0x0);
                }
              }
            }
LAB_0010db0e:
            if (CVar2 == CURLE_OK) {
              CVar2 = CURLE_OK;
              if ((post->showfilename != (char *)0x0) &&
                 ((post->more != (curl_httppost *)0x0 || ((post->flags & 0x51) != 0)))) {
                CVar2 = curl_mime_filename(pcVar4,post->showfilename);
              }
            }
          } while ((CVar2 == CURLE_OK) && (pcVar7 = pcVar7->more, pcVar7 != (curl_httppost *)0x0));
        }
        bVar8 = CVar2 == CURLE_OK;
      } while ((bVar8) && (post = post->next, post != (curl_httppost *)0x0));
    }
    if (!bVar8) {
      Curl_mime_cleanpart(finalform);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_getformdata(struct Curl_easy *data,
                          curl_mimepart *finalform,
                          struct curl_httppost *post,
                          curl_read_callback fread_func)
{
  CURLcode result = CURLE_OK;
  curl_mime *form = NULL;
  curl_mimepart *part;
  struct curl_httppost *file;

  Curl_mime_cleanpart(finalform); /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  form = curl_mime_init(data);
  if(!form)
    result = CURLE_OUT_OF_MEMORY;

  if(!result)
    result = curl_mime_subparts(finalform, form);

  /* Process each top part. */
  for(; !result && post; post = post->next) {
    /* If we have more than a file here, create a mime subpart and fill it. */
    curl_mime *multipart = form;
    if(post->more) {
      part = curl_mime_addpart(form);
      if(!part)
        result = CURLE_OUT_OF_MEMORY;
      if(!result)
        result = setname(part, post->name, post->namelength);
      if(!result) {
        multipart = curl_mime_init(data);
        if(!multipart)
          result = CURLE_OUT_OF_MEMORY;
      }
      if(!result)
        result = curl_mime_subparts(part, multipart);
    }

    /* Generate all the part contents. */
    for(file = post; !result && file; file = file->more) {
      /* Create the part. */
      part = curl_mime_addpart(multipart);
      if(!part)
        result = CURLE_OUT_OF_MEMORY;

      /* Set the headers. */
      if(!result)
        result = curl_mime_headers(part, file->contentheader, 0);

      /* Set the content type. */
      if(!result && file->contenttype)
        result = curl_mime_type(part, file->contenttype);

      /* Set field name. */
      if(!result && !post->more)
        result = setname(part, post->name, post->namelength);

      /* Process contents. */
      if(!result) {
        curl_off_t clen = post->contentslength;

        if(post->flags & CURL_HTTPPOST_LARGE)
          clen = post->contentlen;
        if(!clen)
          clen = -1;

        if(post->flags & (HTTPPOST_FILENAME | HTTPPOST_READFILE)) {
          if(!strcmp(file->contents, "-")) {
            /* There are a few cases where the code below won't work; in
               particular, freopen(stdin) by the caller is not guaranteed
               to result as expected. This feature has been kept for backward
               compatibility: use of "-" pseudo file name should be avoided. */
            result = curl_mime_data_cb(part, (curl_off_t) -1,
                                       (curl_read_callback) fread,
                                       CURLX_FUNCTION_CAST(curl_seek_callback,
                                                           fseek),
                                       NULL, (void *) stdin);
          }
          else
            result = curl_mime_filedata(part, file->contents);
          if(!result && (post->flags & HTTPPOST_READFILE))
            result = curl_mime_filename(part, NULL);
        }
        else if(post->flags & HTTPPOST_BUFFER)
          result = curl_mime_data(part, post->buffer,
                                  post->bufferlength? post->bufferlength: -1);
        else if(post->flags & HTTPPOST_CALLBACK)
          /* the contents should be read with the callback and the size is set
             with the contentslength */
          result = curl_mime_data_cb(part, clen,
                                     fread_func, NULL, NULL, post->userp);
        else {
          result = curl_mime_data(part, post->contents, (ssize_t) clen);
#ifdef CURL_DOES_CONVERSIONS
          /* Convert textual contents now. */
          if(!result && data && part->datasize)
            result = Curl_convert_to_network(data, part->data, part->datasize);
#endif
        }
      }

      /* Set fake file name. */
      if(!result && post->showfilename)
        if(post->more || (post->flags & (HTTPPOST_FILENAME | HTTPPOST_BUFFER |
                                        HTTPPOST_CALLBACK)))
          result = curl_mime_filename(part, post->showfilename);
    }
  }

  if(result)
    Curl_mime_cleanpart(finalform);

  return result;
}